

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

PortConnection * __thiscall
slang::BumpAllocator::
emplace<slang::ast::PortConnection,slang::ast::InterfacePortSymbol_const&,std::pair<slang::ast::Symbol_const*,slang::ast::ModportSymbol_const*>&,slang::ast::Expression_const*&>
          (BumpAllocator *this,InterfacePortSymbol *args,
          pair<const_slang::ast::Symbol_*,_const_slang::ast::ModportSymbol_*> *args_1,
          Expression **args_2)

{
  PortConnection *this_00;
  undefined8 *in_RCX;
  IfaceConn *in_RDX;
  InterfacePortSymbol *in_RSI;
  BumpAllocator *in_RDI;
  
  this_00 = (PortConnection *)allocate(in_RDI,(size_t)in_RSI,(size_t)in_RDX);
  ast::PortConnection::PortConnection(this_00,in_RSI,in_RDX,(Expression *)*in_RCX);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }